

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_frame.c
# Opt level: O0

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,nghttp3_frame_settings *fr)

{
  size_t sVar1;
  size_t sVar2;
  long in_RSI;
  long *in_RDI;
  size_t i;
  size_t payloadlen;
  int64_t in_stack_ffffffffffffffc8;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  for (local_20 = 0; local_20 < *(ulong *)(in_RSI + 0x10); local_20 = local_20 + 1) {
    sVar1 = nghttp3_put_varintlen(in_stack_ffffffffffffffc8);
    sVar2 = nghttp3_put_varintlen(in_stack_ffffffffffffffc8);
    local_18 = sVar1 + sVar2 + local_18;
  }
  *in_RDI = local_18;
  sVar1 = nghttp3_put_varintlen(in_stack_ffffffffffffffc8);
  sVar2 = nghttp3_put_varintlen(in_stack_ffffffffffffffc8);
  return sVar1 + sVar2 + local_18;
}

Assistant:

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,
                                        const nghttp3_frame_settings *fr) {
  size_t payloadlen = 0;
  size_t i;

  for (i = 0; i < fr->niv; ++i) {
    payloadlen += nghttp3_put_varintlen((int64_t)fr->iv[i].id) +
                  nghttp3_put_varintlen((int64_t)fr->iv[i].value);
  }

  *ppayloadlen = (int64_t)payloadlen;

  return nghttp3_put_varintlen(NGHTTP3_FRAME_SETTINGS) +
         nghttp3_put_varintlen((int64_t)payloadlen) + payloadlen;
}